

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_shader_module_handle
          (Impl *this,VkShaderModule module,VkShaderModule *out_module)

{
  bool bVar1;
  LogLevel LVar2;
  pointer pvVar3;
  VkShaderModule_T *pVVar4;
  _Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false> local_30;
  const_iterator itr;
  VkShaderModule *out_module_local;
  VkShaderModule module_local;
  Impl *this_local;
  
  itr.super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false>)
       (_Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false>)out_module;
  out_module_local = (VkShaderModule *)module;
  module_local = (VkShaderModule)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<VkShaderModule_T_*,_unsigned_long,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>_>
       ::find(&this->shader_module_to_hash,(key_type *)&out_module_local);
  local_38._M_cur =
       (__node_type *)
       std::
       end<std::unordered_map<VkShaderModule_T*,unsigned_long,std::hash<VkShaderModule_T*>,std::equal_to<VkShaderModule_T*>,std::allocator<std::pair<VkShaderModule_T*const,unsigned_long>>>>
                 (&this->shader_module_to_hash);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    LVar2 = get_thread_log_level();
    if (((int)LVar2 < 2) &&
       (bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Cannot find shader module in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                          ), !bVar1)) {
      fprintf(_stderr,
              "Fossilize WARN: Cannot find shader module in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
             );
    }
    this_local._7_1_ = false;
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false,_false>
                         *)&local_30);
    pVVar4 = api_object_cast<VkShaderModule_T*,unsigned_long>(pvVar3->second);
    *(VkShaderModule_T **)
     itr.super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_unsigned_long>,_false>._M_cur
         = pVVar4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::remap_shader_module_handle(VkShaderModule module, VkShaderModule *out_module) const
{
	auto itr = shader_module_to_hash.find(module);
	if (itr == end(shader_module_to_hash))
	{
		LOGW_LEVEL("Cannot find shader module in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_module = api_object_cast<VkShaderModule>(uint64_t(itr->second));
		return true;
	}
}